

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

char * url_decode(char *in)

{
  wchar_t wVar1;
  wchar_t wVar2;
  size_t sVar3;
  wchar_t digit2;
  wchar_t digit1;
  char *s;
  char *d;
  char *out;
  char *in_local;
  
  sVar3 = strlen(in);
  in_local = (char *)malloc(sVar3 + 1);
  _digit2 = in;
  s = in_local;
  if (in_local == (char *)0x0) {
    in_local = (char *)0x0;
  }
  else {
    while (*_digit2 != '\0') {
      if (((*_digit2 == '%') && (_digit2[1] != '\0')) && (_digit2[2] != '\0')) {
        wVar1 = tohex((int)_digit2[1]);
        wVar2 = tohex((int)_digit2[2]);
        if ((wVar1 < L'\0') || (wVar2 < L'\0')) goto LAB_0018368a;
        *s = (byte)(wVar1 << 4) | (byte)wVar2;
        _digit2 = _digit2 + 3;
        s = s + 1;
      }
      else {
LAB_0018368a:
        *s = *_digit2;
        _digit2 = _digit2 + 1;
        s = s + 1;
      }
    }
    *s = '\0';
  }
  return in_local;
}

Assistant:

static char *
url_decode(const char *in)
{
	char *out, *d;
	const char *s;

	out = (char *)malloc(strlen(in) + 1);
	if (out == NULL)
		return (NULL);
	for (s = in, d = out; *s != '\0'; ) {
		if (s[0] == '%' && s[1] != '\0' && s[2] != '\0') {
			/* Try to convert % escape */
			int digit1 = tohex(s[1]);
			int digit2 = tohex(s[2]);
			if (digit1 >= 0 && digit2 >= 0) {
				/* Looks good, consume three chars */
				s += 3;
				/* Convert output */
				*d++ = ((digit1 << 4) | digit2);
				continue;
			}
			/* Else fall through and treat '%' as normal char */
		}
		*d++ = *s++;
	}
	*d = '\0';
	return (out);
}